

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_bit_tohex(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  
  TVar1 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x31);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
  TVar1 = lj_opt_fold(J);
  TVar2 = recff_bit64_tohex(J,rd,TVar1);
  (J->fold).ins.field_0.ot = 0x5784;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_tohex(jit_State *J, RecordFFData *rd)
{
#if LJ_HASFFI
  TRef hdr = recff_bufhdr(J);
  TRef tr = recff_bit64_tohex(J, rd, hdr);
  J->base[0] = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
#else
  recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
#endif
}